

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O1

int KangarooTwelve_Final
              (KangarooTwelve_Instance *ktInstance,uchar *output,uchar *customization,
              size_t customLen)

{
  uchar delimitedData;
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t value;
  uchar encbuf [11];
  uchar intermediate [32];
  uchar local_53 [11];
  uchar local_48 [32];
  
  iVar3 = 1;
  if (ktInstance->phase == ABSORBING) {
    if ((customLen != 0) &&
       (iVar1 = KangarooTwelve_Update(ktInstance,customization,customLen), iVar1 != 0)) {
      return 1;
    }
    uVar2 = right_encode(local_53,customLen);
    iVar1 = KangarooTwelve_Update(ktInstance,local_53,(ulong)uVar2);
    if (iVar1 == 0) {
      if (ktInstance->blockNumber == 0) {
        delimitedData = '\a';
      }
      else {
        if (ktInstance->queueAbsorbedLen != 0) {
          ktInstance->blockNumber = ktInstance->blockNumber + 1;
          iVar1 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode,'\v');
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode,local_48,0x20);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,local_48,0x20);
          if (iVar1 != 0) {
            return 1;
          }
        }
        value = ktInstance->blockNumber - 1;
        ktInstance->blockNumber = value;
        uVar2 = right_encode(local_53,value);
        local_53[uVar2] = 0xff;
        local_53[uVar2 + 1] = 0xff;
        iVar1 = KeccakWidth1600_12rounds_SpongeAbsorb
                          (&ktInstance->finalNode,local_53,(ulong)(uVar2 + 2));
        if (iVar1 != 0) {
          return 1;
        }
        delimitedData = '\x06';
      }
      iVar1 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->finalNode,delimitedData)
      ;
      if (iVar1 == 0) {
        if (ktInstance->fixedOutputLength == 0) {
          ktInstance->phase = SQUEEZING;
          iVar3 = 0;
        }
        else {
          ktInstance->phase = FINAL;
          iVar3 = KeccakWidth1600_12rounds_SpongeSqueeze
                            (&ktInstance->finalNode,output,ktInstance->fixedOutputLength);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int KangarooTwelve_Final(KangarooTwelve_Instance *ktInstance, unsigned char * output, const unsigned char * customization, size_t customLen)
{
    unsigned char encbuf[sizeof(size_t)+1+2];
    unsigned char padding;

    if (ktInstance->phase != ABSORBING)
        return 1;

    /* Absorb customization | right_encode(customLen) */
    if ((customLen != 0) && (KangarooTwelve_Update(ktInstance, customization, customLen) != 0))
        return 1;
    if (KangarooTwelve_Update(ktInstance, encbuf, right_encode(encbuf, customLen)) != 0)
        return 1;

    if ( ktInstance->blockNumber == 0 ) {
        /* Non complete first block in final node, pad it */
        padding = 0x07; /*  '11': message hop, final node */
    }
    else {
        unsigned int n;

        if ( ktInstance->queueAbsorbedLen != 0 ) {
            /* There is data in the queue node */
            unsigned char intermediate[capacityInBytes];
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
        --ktInstance->blockNumber; /* Absorb right_encode(number of Chaining Values) || 0xFF || 0xFF */
        n = right_encode(encbuf, ktInstance->blockNumber);
        encbuf[n++] = 0xFF;
        encbuf[n++] = 0xFF;
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, encbuf, n) != 0)
            return 1;
        padding = 0x06; /* '01': chaining hop, final node */
    }
    if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->finalNode, padding) != 0)
        return 1;
    if ( ktInstance->fixedOutputLength != 0 ) {
        ktInstance->phase = FINAL;
        return KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->finalNode, output, ktInstance->fixedOutputLength);
    }
    ktInstance->phase = SQUEEZING;
    return 0;
}